

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Node * __thiscall
spoa::Graph::AddSequence
          (Graph *this,char *sequence,vector<unsigned_int,_std::allocator<unsigned_int>_> *weights,
          uint32_t begin,uint32_t end)

{
  value_type vVar1;
  uint32_t *puVar2;
  Node *head;
  const_reference pvVar3;
  size_type sVar4;
  reference this_00;
  Node *curr;
  Node *pNStack_38;
  uint32_t i;
  Node *prev;
  uint32_t end_local;
  uint32_t begin_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *weights_local;
  char *sequence_local;
  Graph *this_local;
  
  if (begin == end) {
    this_local = (Graph *)0x0;
  }
  else {
    pNStack_38 = (Node *)0x0;
    for (curr._4_4_ = begin; curr._4_4_ < end; curr._4_4_ = curr._4_4_ + 1) {
      puVar2 = (uint32_t *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->coder_,(long)sequence[curr._4_4_]);
      head = AddNode(this,*puVar2);
      if (pNStack_38 != (Node *)0x0) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (weights,(ulong)(curr._4_4_ - 1));
        vVar1 = *pvVar3;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (weights,(ulong)curr._4_4_);
        AddEdge(this,pNStack_38,head,vVar1 + *pvVar3);
      }
      pNStack_38 = head;
    }
    sVar4 = std::
            vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
            ::size(&this->nodes_);
    this_00 = std::
              vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
              ::operator[](&this->nodes_,sVar4 - (end - begin));
    this_local = (Graph *)std::
                          unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
                          get(this_00);
  }
  return (Node *)this_local;
}

Assistant:

Graph::Node* Graph::AddSequence(
    const char* sequence,
    const std::vector<std::uint32_t>& weights,
    std::uint32_t begin,
    std::uint32_t end) {
  if (begin == end) {
    return nullptr;
  }
  Node* prev = nullptr;
  for (std::uint32_t i = begin; i < end; ++i) {
    auto curr = AddNode(coder_[sequence[i]]);
    if (prev) {  // both nodes contribute to the weight
      AddEdge(prev, curr, weights[i - 1] + weights[i]);
    }
    prev = curr;
  }
  return nodes_[nodes_.size() - (end - begin)].get();
}